

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableElimination.cpp
# Opt level: O0

PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
* __thiscall
Inferences::ALASCA::
PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
::next(PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
       *this)

{
  bool bVar1;
  byte bVar2;
  bool *__value;
  ulong uVar3;
  size_t sVar4;
  PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *in_RDI;
  uint i;
  vector<bool,_std::allocator<bool>_> *par;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  Option<std::vector<bool,_std::allocator<bool>_>_> *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  size_type in_stack_ffffffffffffff18;
  undefined1 *__n;
  reference local_d8;
  reference local_c8;
  reference local_b8;
  reference local_a8;
  reference local_98;
  int local_84;
  vector<bool,_std::allocator<bool>_> *local_80;
  undefined1 local_62;
  undefined1 local_61;
  
  bVar1 = Lib::Option<std::vector<bool,_std::allocator<bool>_>_>::isNone
                    ((Option<std::vector<bool,_std::allocator<bool>_>_> *)0x727105);
  if (bVar1) {
    __value = (bool *)Lib::
                      Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      ::size((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                              *)in_RDI);
    local_61 = 0;
    __n = &local_62;
    std::allocator<bool>::allocator((allocator<bool> *)0x727137);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)in_RDI,(size_type)__n,__value,
               (allocator_type *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    Lib::some<std::vector<bool,std::allocator<bool>>>
              ((vector<bool,_std::allocator<bool>_> *)
               CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    Lib::Option<std::vector<bool,_std::allocator<bool>_>_>::operator=
              (in_stack_ffffffffffffff00,
               (Option<std::vector<bool,_std::allocator<bool>_>_> *)
               CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    Lib::Option<std::vector<bool,_std::allocator<bool>_>_>::~Option
              ((Option<std::vector<bool,_std::allocator<bool>_>_> *)0x727194);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x7271a1);
    std::allocator<bool>::~allocator((allocator<bool> *)0x7271ae);
    sVar4 = Lib::
            Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
            ::size((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    *)in_RDI);
    if (sVar4 == 0) {
      in_RDI->_finished = true;
    }
  }
  else {
    local_80 = Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::unwrap
                         ((OptionBase<std::vector<bool,_std::allocator<bool>_>_> *)0x727248);
    local_84 = 0;
    while( true ) {
      local_98 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)in_RDI,in_stack_ffffffffffffff18)
      ;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_98);
      if (!bVar1) break;
      local_a8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)in_RDI,in_stack_ffffffffffffff18)
      ;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_a8);
      bVar2 = bVar1 ^ 0xff;
      local_b8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)in_RDI,in_stack_ffffffffffffff18)
      ;
      std::_Bit_reference::operator=(&local_b8,(bool)(bVar2 & 1));
      local_84 = local_84 + 1;
    }
    local_c8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_RDI,in_stack_ffffffffffffff18);
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_c8);
    bVar2 = bVar1 ^ 0xff;
    local_d8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_RDI,in_stack_ffffffffffffff18);
    std::_Bit_reference::operator=(&local_d8,(bool)(bVar2 & 1));
    uVar3 = (ulong)(local_84 + 1);
    sVar4 = Lib::
            Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
            ::size((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    *)in_RDI);
    if (sVar4 <= uVar3) {
      in_RDI->_finished = true;
    }
  }
  return in_RDI;
}

Assistant:

PartitionIter& next() { 
    if (_partition.isNone()) {
      _partition = some(std::vector<bool>(_orig.size(), false));
      if (_orig.size() == 0) {
        _finished = true;
      }
    } else {
      auto& par = _partition.unwrap();
      unsigned i = 0;
      for (; par[i]; i++) {
        par[i] = !par[i];
      }
      par[i] = !par[i];
      if (i + 1 >= _orig.size()) {
        _finished = true;
      }
    }
    return *this;
  }